

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpd.cpp
# Opt level: O2

int main(void)

{
  HttpServer httpd;
  EventLoopGroup group;
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  undefined1 local_158 [16];
  string local_148;
  HttpServer local_128;
  string local_f8 [32];
  string local_d8;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  EventLoopGroup local_98;
  
  std::__cxx11::string::string((string *)&local_128,"EPOLL",(allocator *)&local_148);
  Liby::EventLoopGroup::EventLoopGroup(&local_98,0,&local_128.root_);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_148,"/home/ccsexyz",&local_159);
  std::__cxx11::string::string((string *)&local_d8,"localhost",&local_15a);
  std::__cxx11::string::string(local_f8,"8080",&local_15b);
  Liby::EventLoopGroup::creatTcpServer((EventLoopGroup *)local_158,(string *)&local_98,&local_d8);
  Liby::http::HttpServer::HttpServer(&local_128,&local_148,(shared_ptr<Liby::TcpServer> *)local_158)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_148);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
             ::_M_manager;
  Liby::EventLoopGroup::run(&local_98,(BoolFunctor *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  Liby::http::HttpServer::~HttpServer(&local_128);
  Liby::EventLoopGroup::~EventLoopGroup(&local_98);
  return 0;
}

Assistant:

int main(void) {
    EventLoopGroup group;
    HttpServer httpd("/home/ccsexyz",
                     group.creatTcpServer("localhost", "8080"));
    group.run();
    return 0;
}